

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_array_copy
          (CompilerGLSL *this,string *lhs,uint32_t rhs_id,StorageClass param_3,StorageClass param_4)

{
  undefined1 local_48 [44];
  StorageClass param_4_local;
  StorageClass param_3_local;
  uint32_t rhs_id_local;
  string *lhs_local;
  CompilerGLSL *this_local;
  
  local_48._36_4_ = param_4;
  local_48._40_4_ = param_3;
  param_4_local = rhs_id;
  _param_3_local = lhs;
  lhs_local = (string *)this;
  to_expression_abi_cxx11_((CompilerGLSL *)local_48,(uint32_t)this,SUB41(rhs_id,0));
  statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
            (this,lhs,(char (*) [4])0x4f38c2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (char (*) [2])0x4d9ce2);
  ::std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void CompilerGLSL::emit_array_copy(const string &lhs, uint32_t rhs_id, StorageClass, StorageClass)
{
	statement(lhs, " = ", to_expression(rhs_id), ";");
}